

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LifNeuron.cpp
# Opt level: O0

void __thiscall LifNeuron::RelaxOutput(LifNeuron *this,float time,bool withSpike)

{
  float fVar1;
  double dVar2;
  bool withSpike_local;
  float time_local;
  LifNeuron *this_local;
  
  if (this->tOut < 0.0) {
    this->a = (float)withSpike;
  }
  else {
    fVar1 = this->a;
    dVar2 = std::exp((double)(ulong)(uint)((this->tOut - time) / this->tau));
    this->a = fVar1 * SUB84(dVar2,0) + (float)withSpike;
  }
  if ((withSpike) && (this->tOut = time, this->fts <= 0.0 && this->fts != 0.0)) {
    this->fts = time;
  }
  return;
}

Assistant:

void LifNeuron::RelaxOutput( float time, bool withSpike )
{
    if ( tOut >= 0 ) {
        a = a * exp(( tOut - time ) / tau ) + withSpike;
    } else {
        a = withSpike;
    }
    if ( withSpike ) {
        tOut = time;
        if ( fts < 0 ) {
            fts = time;
        }
    }
}